

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeDensityZ.cpp
# Opt level: O3

void __thiscall OpenMD::ChargeDensityZ::process(ChargeDensityZ *this)

{
  Mat3x3d *pMVar1;
  undefined8 *puVar2;
  _Rb_tree_node_base *p_Var3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  SimInfo *info;
  Snapshot *pSVar7;
  iterator iVar8;
  double *pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  undefined8 uVar12;
  size_type sVar13;
  bool bVar14;
  int iVar15;
  long lVar16;
  double *pdVar17;
  _Base_ptr p_Var18;
  StuntDouble *pSVar19;
  undefined1 *puVar20;
  mapped_type *pmVar21;
  mapped_type *pmVar22;
  mapped_type_conflict *pmVar23;
  vector<double,std::allocator<double>> *pvVar24;
  mapped_type *pmVar25;
  pointer pdVar26;
  uint i;
  AtomType *this_00;
  uint i_1;
  size_t index;
  pointer ppAVar27;
  ulong uVar28;
  double *pdVar29;
  long lVar30;
  ulong uVar31;
  RealType RVar32;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  double dVar39;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar40;
  int globalIndex;
  string atomName;
  RealType q;
  Vector3d pos;
  int kk;
  vector<int,_std::allocator<int>_> cartesian_axis;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> atChain;
  set<int,_std::less<int>,_std::allocator<int>_> axisValues;
  DumpReader reader;
  int local_143c;
  key_type local_1438;
  double local_1418;
  int local_140c;
  undefined1 local_1408 [40];
  mapped_type_conflict local_13e0;
  double local_13d8;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_13d0;
  _Base_ptr local_13c8;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_13c0;
  double local_13b8;
  SelectionManager *local_13b0;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_13a8;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_13a0;
  _Base_ptr local_1398;
  _Rb_tree_node_base *local_1390;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_1388;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1380;
  int *local_1378;
  double local_1370;
  double local_1368;
  int local_135c;
  mapped_type_conflict local_1358;
  undefined8 uStack_1350;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_1348;
  undefined8 uStack_1340;
  uint *local_1338;
  iterator iStack_1330;
  int *local_1328;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> local_1320;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *local_1308;
  undefined8 uStack_1300;
  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  *local_12f8;
  undefined8 uStack_12f0;
  long local_12e0;
  SelectionEvaluator *local_12d8;
  undefined1 local_12d0 [16];
  _Base_ptr local_12c0 [3];
  double local_12a8;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  local_1368 = (double)CONCAT71(local_1368._1_7_,
                                (info->simParams_->UsePeriodicBoundaryConditions).
                                super_ParameterBase.field_0x2b);
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  local_140c = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = local_140c / (this->super_StaticAnalyser).step_;
  DumpReader::readFrame(&local_1288,1);
  pSVar7 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
  this->currentSnapshot_ = pSVar7;
  Snapshot::getHmat((Mat3x3d *)local_12d0,pSVar7);
  pMVar1 = &this->hmat_;
  if (pMVar1 != (Mat3x3d *)local_12d0) {
    lVar16 = 0;
    do {
      *(undefined8 *)
       ((long)(this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
       + lVar16 + 0x10) = *(undefined8 *)((long)local_12c0 + lVar16);
      uVar12 = *(undefined8 *)(local_12d0 + lVar16 + 8);
      puVar2 = (undefined8 *)
               ((long)(pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar16);
      *puVar2 = *(undefined8 *)(local_12d0 + lVar16);
      puVar2[1] = uVar12;
      lVar16 = lVar16 + 0x18;
    } while (lVar16 != 0x48);
  }
  pdVar29 = (double *)
            ((long)(pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
            (ulong)(uint)this->axis_ * 0x20);
  iVar8._M_current =
       (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar8._M_current ==
      (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->zBox_,iVar8,pdVar29);
    pdVar29 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    *iVar8._M_current = *pdVar29;
    pdVar29 = iVar8._M_current + 1;
    (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar29;
  }
  local_13b8 = 0.0;
  pdVar9 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar17 = pdVar9; pdVar17 != pdVar29; pdVar17 = pdVar17 + 1) {
    local_13b8 = local_13b8 + *pdVar17;
  }
  p_Var3 = (_Rb_tree_node_base *)(local_12d0 + 8);
  local_12d0._8_4_ = _S_red;
  local_12c0[0] = (_Base_ptr)0x0;
  local_12a8 = 0.0;
  local_1438._M_dataplus._M_p._0_4_ = 0;
  local_12c0[1] = p_Var3;
  local_12c0[2] = p_Var3;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_12d0,(int *)&local_1438);
  local_1438._M_dataplus._M_p._0_4_ = 1;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_12d0,(int *)&local_1438);
  local_1438._M_dataplus._M_p._0_4_ = 2;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_12d0,(int *)&local_1438);
  local_1378 = &this->axis_;
  pVar40 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
           equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)local_12d0,local_1378);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_12d0,(_Base_ptr)pVar40.first._M_node,(_Base_ptr)pVar40.second._M_node);
  lVar16 = (long)pdVar29 - (long)pdVar9;
  lVar30 = lVar16 >> 3;
  auVar34._8_4_ = (int)(lVar16 >> 0x23);
  auVar34._0_8_ = lVar30;
  auVar34._12_4_ = 0x45300000;
  local_13b8 = local_13b8 /
               ((auVar34._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar30) - 4503599627370496.0));
  local_1338 = (uint *)0x0;
  iStack_1330._M_current = (int *)0x0;
  local_1328 = (int *)0x0;
  p_Var18 = local_12c0[1];
  do {
    if (iStack_1330._M_current == local_1328) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_1338,iStack_1330,(int *)(p_Var18 + 1));
    }
    else {
      *iStack_1330._M_current = p_Var18[1]._M_color;
      iStack_1330._M_current = iStack_1330._M_current + 1;
    }
    p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
  } while (p_Var18 != p_Var3);
  uVar4 = *local_1338;
  this->x_ = uVar4;
  uVar5 = local_1338[1];
  this->y_ = uVar5;
  local_1370 = *(double *)
                ((long)(pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_ + (ulong)uVar4 * 0x20) *
               *(double *)
                ((long)(pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_ + (ulong)uVar5 * 0x20);
  local_12e0 = (long)(this->densityZAverageAllFrame_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->densityZAverageAllFrame_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
  if (1 < local_140c) {
    local_12d8 = &this->evaluator_;
    local_13b0 = &this->seleMan_;
    local_1380 = &this->atomNameGlobalIndex_;
    local_13c0 = &this->countUsingGlobalIndex_;
    local_13d0 = &this->averageChargeUsingGlobalIndex_;
    local_12f8 = &this->totalChargeUsingGlobalIndex_;
    local_1388 = &this->zPosUsingGlobalIndex_;
    local_1390 = (_Rb_tree_node_base *)&this->xPosUsingGlobalIndex_;
    local_1398 = (_Base_ptr)&this->yPosUsingGlobalIndex_;
    local_13a0 = &this->vanderRUsingGlobalIndex_;
    local_13c8 = &(this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1348 = &this->SDCount_;
    local_1308 = &this->averageChargeForEachType_;
    iVar15 = 1;
    do {
      local_13a8 = (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)CONCAT44(local_13a8._4_4_,iVar15);
      DumpReader::readFrame(&local_1288,iVar15);
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      if ((this->evaluator_).isDynamic_ == true) {
        SelectionEvaluator::evaluate((SelectionSet *)&local_1438,local_12d8);
        lVar16 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar16),(vector<bool,_std::allocator<bool>_> *)
                             (local_1438._M_dataplus._M_p + lVar16));
          lVar16 = lVar16 + 0x28;
        } while (lVar16 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
                   &local_1438);
      }
      pSVar19 = SelectionManager::beginSelected(local_13b0,&local_135c);
      while (pSVar19 != (StuntDouble *)0x0) {
        if (pSVar19->objType_ < otRigidBody) {
          this_00 = (AtomType *)pSVar19[1]._vptr_StuntDouble;
LAB_001949cb:
          local_1418 = 0.0;
          local_1438._M_dataplus._M_p = (pointer)this_00;
          bVar14 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)&local_1438);
          if (bVar14) {
            RVar32 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)&local_1438);
            local_1418 = RVar32 + local_1418;
          }
          local_1408._0_8_ = this_00;
          bVar14 = FluctuatingChargeAdapter::isFluctuatingCharge
                             ((FluctuatingChargeAdapter *)local_1408);
          if (bVar14) {
            local_1418 = *(double *)
                          (*(long *)((long)&(pSVar19->snapshotMan_->currentSnapshot_->atomData).
                                            flucQPos.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                    pSVar19->storage_) + (long)pSVar19->localIndex_ * 8) +
                         local_1418;
          }
        }
        else {
          memcpy(&painCave,"Can not calculate charge density distribution if it is not atom\n",0x41)
          ;
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
          local_1418 = 0.0;
          this_00 = (AtomType *)pSVar19[1]._vptr_StuntDouble;
          if (pSVar19->objType_ < otRigidBody) goto LAB_001949cb;
        }
        local_1438._M_dataplus._M_p = (pointer)&local_1438.field_2;
        local_1438._M_string_length = 0;
        local_1438.field_2._M_local_buf[0] = '\0';
        AtomType::allYourBase(&local_1320,this_00);
        for (ppAVar27 = local_1320.
                        super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            ppAVar27 !=
            local_1320.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
            _M_impl.super__Vector_impl_data._M_finish; ppAVar27 = ppAVar27 + 1) {
          AtomType::getName_abi_cxx11_((string *)local_1408,*ppAVar27);
          uVar12 = local_1408._0_8_;
          sVar13 = local_1438._M_string_length;
          strlen((char *)local_1408._0_8_);
          std::__cxx11::string::_M_replace((ulong)&local_1438,0,(char *)sVar13,uVar12);
          if ((AtomType *)local_1408._0_8_ != (AtomType *)(local_1408 + 0x10)) {
            operator_delete((void *)local_1408._0_8_,local_1408._16_8_ + 1);
          }
          AtomType::getName_abi_cxx11_((string *)local_1408,*ppAVar27);
          iVar15 = ElementsTable::GetAtomicNum((ElementsTable *)etab,(char *)local_1408._0_8_);
          if ((AtomType *)local_1408._0_8_ != (AtomType *)(local_1408 + 0x10)) {
            operator_delete((void *)local_1408._0_8_,local_1408._16_8_ + 1);
          }
          if (iVar15 != 0) {
            local_1358 = ElementsTable::GetVdwRad((ElementsTable *)etab,iVar15);
            goto LAB_00194b39;
          }
        }
        local_1358 = this->vRadius_;
LAB_00194b39:
        pmVar33 = local_13c0;
        puVar20 = (undefined1 *)
                  ((long)pSVar19->localIndex_ * 0x18 +
                  *(long *)((long)&(pSVar19->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar19->storage_));
        local_1408._0_8_ = (AtomType *)0x0;
        local_1408._8_8_ = 0.0;
        local_1408._16_8_ = 0;
        if (puVar20 != local_1408) {
          lVar16 = 0;
          do {
            *(undefined8 *)(local_1408 + lVar16 * 8) = *(undefined8 *)(puVar20 + lVar16 * 8);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
        }
        if (local_1368._0_1_ != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)local_1408);
        }
        pSVar7 = pSVar19->snapshotMan_->currentSnapshot_;
        lVar30 = (long)pSVar19->localIndex_;
        lVar16 = *(long *)((long)&(pSVar7->atomData).position.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar19->storage_);
        puVar20 = (undefined1 *)(lVar16 + lVar30 * 0x18);
        if (puVar20 != local_1408) {
          lVar16 = 0;
          do {
            *(undefined8 *)(puVar20 + lVar16 * 8) = *(undefined8 *)(local_1408 + lVar16 * 8);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          lVar16 = *(long *)((long)&(pSVar7->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar19->storage_);
        }
        puVar2 = (undefined8 *)(lVar16 + lVar30 * 0x18);
        local_1408._0_8_ = *puVar2;
        local_1408._8_8_ = puVar2[1];
        local_1408._16_8_ = *(size_type *)(lVar16 + 0x10 + lVar30 * 0x18);
        local_143c = pSVar19->globalIndex_;
        pmVar21 = std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](local_1380,&local_143c);
        std::__cxx11::string::_M_assign((string *)pmVar21);
        pmVar22 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](pmVar33,&local_143c);
        iVar15 = *pmVar22;
        pmVar23 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[](local_13d0,&local_143c);
        local_13e0 = *pmVar23;
        local_13d8 = local_1418;
        pmVar22 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](pmVar33,&local_143c);
        iVar6 = *pmVar22;
        pmVar23 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[](local_13d0,&local_143c);
        *pmVar23 = ((double)iVar15 * local_13e0 + local_13d8) / (double)(iVar6 + 1);
        pvVar24 = (vector<double,std::allocator<double>> *)
                  std::
                  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](local_12f8,&local_143c);
        iVar8._M_current = *(double **)(pvVar24 + 8);
        if (iVar8._M_current == *(double **)(pvVar24 + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (pvVar24,iVar8,&local_1418);
        }
        else {
          *iVar8._M_current = local_1418;
          *(double **)(pvVar24 + 8) = iVar8._M_current + 1;
        }
        pvVar24 = (vector<double,std::allocator<double>> *)
                  std::
                  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](local_1388,&local_143c);
        iVar8._M_current = *(double **)(pvVar24 + 8);
        if (iVar8._M_current == *(double **)(pvVar24 + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (pvVar24,iVar8,(double *)(local_1408 + (ulong)(uint)*local_1378 * 8));
        }
        else {
          *iVar8._M_current = *(double *)(local_1408 + (ulong)(uint)*local_1378 * 8);
          *(double **)(pvVar24 + 8) = iVar8._M_current + 1;
        }
        pvVar24 = (vector<double,std::allocator<double>> *)
                  std::
                  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                                *)local_1390,&local_143c);
        iVar8._M_current = *(double **)(pvVar24 + 8);
        if (iVar8._M_current == *(double **)(pvVar24 + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (pvVar24,iVar8,(double *)(local_1408 + (ulong)(uint)this->x_ * 8));
        }
        else {
          *iVar8._M_current = *(double *)(local_1408 + (ulong)(uint)this->x_ * 8);
          *(double **)(pvVar24 + 8) = iVar8._M_current + 1;
        }
        pvVar24 = (vector<double,std::allocator<double>> *)
                  std::
                  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[]((map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                                *)local_1398,&local_143c);
        iVar8._M_current = *(double **)(pvVar24 + 8);
        if (iVar8._M_current == *(double **)(pvVar24 + 0x10)) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (pvVar24,iVar8,(double *)(local_1408 + (ulong)(uint)this->y_ * 8));
        }
        else {
          *iVar8._M_current = *(double *)(local_1408 + (ulong)(uint)this->y_ * 8);
          *(double **)(pvVar24 + 8) = iVar8._M_current + 1;
        }
        pmVar23 = std::
                  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                  operator[](local_13a0,&local_143c);
        *pmVar23 = local_1358;
        pmVar22 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](pmVar33,&local_143c);
        *pmVar22 = *pmVar22 + 1;
        if (local_1320.super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1320.
                          super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1320.
                                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1320.
                                super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1438._M_dataplus._M_p != &local_1438.field_2) {
          operator_delete(local_1438._M_dataplus._M_p,
                          CONCAT71(local_1438.field_2._M_allocated_capacity._1_7_,
                                   local_1438.field_2._M_local_buf[0]) + 1);
        }
        pSVar19 = SelectionManager::nextSelected(local_13b0,&local_135c);
      }
      p_Var18 = (this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var18 != local_13c8) {
        do {
          local_1408._0_4_ = p_Var18[1]._M_color;
          local_1438._M_dataplus._M_p = (pointer)&local_1438.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1438,p_Var18[1]._M_parent,
                     (long)&(p_Var18[1]._M_left)->_M_color + (long)p_Var18[1]._M_parent);
          pmVar22 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](local_1348,&local_1438);
          local_13d8 = (double)*pmVar22;
          pmVar23 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    ::operator[](local_1308,&local_1438);
          local_13e0 = *pmVar23;
          pmVar25 = std::
                    map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](local_12f8,(key_type *)local_1408);
          local_1358 = *(pmVar25->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
          pmVar22 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](local_1348,&local_1438);
          iVar15 = *pmVar22;
          pmVar23 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    ::operator[](local_1308,&local_1438);
          *pmVar23 = (local_13d8 * local_13e0 + local_1358) / (double)(iVar15 + 1);
          pmVar22 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](local_1348,&local_1438);
          *pmVar22 = *pmVar22 + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1438._M_dataplus._M_p != &local_1438.field_2) {
            operator_delete(local_1438._M_dataplus._M_p,
                            CONCAT71(local_1438.field_2._M_allocated_capacity._1_7_,
                                     local_1438.field_2._M_local_buf[0]) + 1);
          }
          p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
        } while (p_Var18 != local_13c8);
      }
      iVar15 = (int)local_13a8 + (this->super_StaticAnalyser).step_;
    } while (iVar15 < local_140c);
  }
  p_Var18 = (this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1398 = &(this->atomNameGlobalIndex_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var18 != local_1398) {
    auVar35._8_4_ = (int)(local_12e0 >> 0x23);
    auVar35._0_8_ = local_12e0 >> 3;
    auVar35._12_4_ = 0x45300000;
    local_1370 = local_1370 *
                 (local_13b8 /
                 ((auVar35._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)(local_12e0 >> 3)) - 4503599627370496.0)));
    local_13a0 = &this->averageChargeUsingGlobalIndex_;
    local_13c8 = (_Base_ptr)&this->averageChargeForEachType_;
    local_13a8 = &this->vanderRUsingGlobalIndex_;
    local_1378 = (int *)(local_13b8 * 0.5);
    do {
      local_1408._0_4_ = p_Var18[1]._M_color;
      local_1438._M_dataplus._M_p = (pointer)&local_1438.field_2;
      local_1390 = p_Var18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1438,p_Var18[1]._M_parent,
                 (long)&(p_Var18[1]._M_left)->_M_color + (long)p_Var18[1]._M_parent);
      pmVar23 = std::
                map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                operator[](local_13a0,(key_type *)local_1408);
      local_1380 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)*pmVar23;
      pmVar23 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                              *)local_13c8,&local_1438);
      local_1388 = (map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    *)*pmVar23;
      pmVar23 = std::
                map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                operator[](local_13a8,(key_type *)local_1408);
      dVar38 = *pmVar23;
      local_13d0 = (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)(dVar38 * 6.283185307179586 * dVar38);
      local_13b0 = (SelectionManager *)(dVar38 * dVar38 + dVar38 * dVar38);
      local_1368 = SQRT((double)local_13d0);
      for (uVar28 = 0;
          pmVar25 = std::
                    map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                    ::operator[](&this->zPosUsingGlobalIndex_,(key_type *)local_1408),
          uVar28 < (ulong)((long)(pmVar25->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pmVar25->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar28 = uVar28 + 1
          ) {
        pmVar25 = std::
                  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](&this->zPosUsingGlobalIndex_,(key_type *)local_1408);
        local_13d8 = (pmVar25->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar28];
        pmVar25 = std::
                  map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator[](&this->totalChargeUsingGlobalIndex_,(key_type *)local_1408);
        if ((this->densityFlucZAverageAllFrame_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this->densityFlucZAverageAllFrame_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_13e0 = (pmVar25->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar28];
          dVar38 = ABS(local_13e0 - (double)local_1380);
          local_1358 = (mapped_type_conflict)
                       (-(ulong)(1e-10 < dVar38) & (ulong)(local_13e0 - (double)local_1380));
          uStack_1350 = 0;
          dVar39 = ABS(local_13e0 - (double)local_1388);
          local_1348 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)(-(ulong)(1e-10 < dVar39) & (ulong)(local_13e0 - (double)local_1388));
          uStack_1340 = 0;
          dVar38 = (double)(-(ulong)(1e-10 < dVar38) & (ulong)dVar38);
          local_12f8 = (map<int,_std::vector<double,_std::allocator<double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
                        *)(dVar38 * dVar38);
          uStack_12f0 = 0;
          dVar39 = (double)(-(ulong)(1e-10 < dVar39) & (ulong)dVar39);
          local_1308 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                        *)(dVar39 * dVar39);
          uStack_1300 = 0;
          pdVar26 = (this->densityZAverageAllFrame_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar31 = 0;
          do {
            auVar36._8_4_ = (int)(uVar31 >> 0x20);
            auVar36._0_8_ = uVar31;
            auVar36._12_4_ = 0x45300000;
            lVar16 = (long)(this->densityZAverageAllFrame_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar26;
            lVar30 = lVar16 >> 3;
            auVar37._8_4_ = (int)(lVar16 >> 0x23);
            auVar37._0_8_ = lVar30;
            auVar37._12_4_ = 0x45300000;
            dVar38 = local_13d8 -
                     ((((auVar36._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar31) - 4503599627370496.0)) * local_13b8
                      ) / ((auVar37._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar30) - 4503599627370496.0)) -
                     (double)local_1378);
            pmVar33 = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      exp((-dVar38 * dVar38) / (double)local_13b0);
            dVar38 = local_1368;
            if ((double)local_13d0 < 0.0) {
              local_13c0 = pmVar33;
              dVar38 = sqrt((double)local_13d0);
              pmVar33 = local_13c0;
            }
            dVar38 = (double)pmVar33 / (dVar38 * local_1370);
            pdVar26 = (this->densityZAverageAllFrame_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar26[uVar31] = local_13e0 * dVar38 + pdVar26[uVar31];
            pdVar10 = (this->densityFlucZAverageAllFrame_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar10[uVar31] = local_1358 * dVar38 + pdVar10[uVar31];
            pdVar11 = (this->absDensityFlucZAverageAllFrame_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar11[uVar31] = (double)local_12f8 * dVar38 + pdVar11[uVar31];
            pdVar11 = (this->densityFlucZAverageFirstFrame_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar11[uVar31] = (double)local_1348 * dVar38 + pdVar11[uVar31];
            pdVar11 = (this->absDensityFlucZAverageFirstFrame_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar11[uVar31] = dVar38 * (double)local_1308 + pdVar11[uVar31];
            uVar31 = uVar31 + 1;
          } while (uVar31 < (ulong)((long)(this->densityFlucZAverageAllFrame_).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar10
                                   >> 3));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1438._M_dataplus._M_p != &local_1438.field_2) {
        operator_delete(local_1438._M_dataplus._M_p,
                        CONCAT71(local_1438.field_2._M_allocated_capacity._1_7_,
                                 local_1438.field_2._M_local_buf[0]) + 1);
      }
      p_Var18 = (_Base_ptr)std::_Rb_tree_increment(local_1390);
    } while (p_Var18 != local_1398);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  if (this->genXYZ_ == true) {
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])(this);
  }
  if (local_1338 != (uint *)0x0) {
    operator_delete(local_1338,(long)local_1328 - (long)local_1338);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_12d0);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void ChargeDensityZ::process() {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames_ = reader.getNFrames();
    nProcessed_  = nFrames_ / step_;

    // test using global index starts hereby

    reader.readFrame(1);
    currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

    hmat_ = currentSnapshot_->getHmat();
    zBox_.push_back(hmat_(axis_, axis_));

    std::vector<RealType>::iterator j;
    RealType zSum = 0.0;
    for (j = zBox_.begin(); j != zBox_.end(); ++j) {
      zSum += *j;
    }

    RealType zAve = zSum / zBox_.size();
    set<int> axisValues;
    axisValues.insert(0);
    axisValues.insert(1);
    axisValues.insert(2);
    axisValues.erase(axis_);
    set<int>::iterator axis_it;
    std::vector<int> cartesian_axis;
    for (axis_it = axisValues.begin(); axis_it != axisValues.end(); ++axis_it) {
      cartesian_axis.push_back(*axis_it);
    }
    x_                   = cartesian_axis[0];
    y_                   = cartesian_axis[1];
    RealType area        = hmat_(x_, x_) * hmat_(y_, y_);
    RealType sliceVolume = zAve / densityZAverageAllFrame_.size() * area;

    for (int i = 1; i < nFrames_; i += step_) {
      reader.readFrame(i);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      int kk;
      for (StuntDouble* sd = seleMan_.beginSelected(kk); sd != NULL;
           sd              = seleMan_.nextSelected(kk)) {
        if (!sd->isAtom()) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not calculate charge density distribution if it is not "
                   "atom\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        RealType q = 0.0;
        Atom* atom = static_cast<Atom*>(sd);

        AtomType* atomType = atom->getAtomType();

        if (sd->isAtom()) {
          FixedChargeAdapter fca = FixedChargeAdapter(atomType);
          if (fca.isFixedCharge()) { q += fca.getCharge(); }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
          if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }
        }
        int obanum(0);
        RealType sigma(0);
        std::string atomName;
        std::vector<AtomType*> atChain = atomType->allYourBase();
        std::vector<AtomType*>::iterator i;
        for (i = atChain.begin(); i != atChain.end(); ++i) {
          atomName = (*i)->getName().c_str();
          obanum   = etab.GetAtomicNum((*i)->getName().c_str());
          if (obanum != 0) {
            sigma = etab.GetVdwRad(obanum);
            break;
          }
        }
        if (obanum == 0) { sigma = vRadius_; }

        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);

        pos = sd->getPos();

        int globalIndex = sd->getGlobalIndex();

        atomNameGlobalIndex_[globalIndex] = atomName;
        averageChargeUsingGlobalIndex_[globalIndex] =
            (countUsingGlobalIndex_[globalIndex] *
                 averageChargeUsingGlobalIndex_[globalIndex] +
             q) /
            (countUsingGlobalIndex_[globalIndex] + 1);
        totalChargeUsingGlobalIndex_[globalIndex].push_back(q);
        zPosUsingGlobalIndex_[globalIndex].push_back(pos[axis_]);
        xPosUsingGlobalIndex_[globalIndex].push_back(pos[x_]);
        yPosUsingGlobalIndex_[globalIndex].push_back(pos[y_]);

        vanderRUsingGlobalIndex_[globalIndex] = sigma;
        countUsingGlobalIndex_[globalIndex]++;
      }

      for (std::map<int, std::string>::iterator it =
               atomNameGlobalIndex_.begin();
           it != atomNameGlobalIndex_.end(); ++it) {
        int g_Index        = it->first;
        std::string a_name = it->second;
        averageChargeForEachType_[a_name] =
            (SDCount_[a_name] * averageChargeForEachType_[a_name] +
             totalChargeUsingGlobalIndex_[g_Index].front()) /
            (SDCount_[a_name] + 1);
        SDCount_[a_name]++;
      }
    }
    RealType epsilon = 1e-10;
    for (std::map<int, std::string>::iterator it = atomNameGlobalIndex_.begin();
         it != atomNameGlobalIndex_.end(); ++it) {
      int key            = it->first;
      std::string a_name = it->second;

      RealType averageCharge = averageChargeUsingGlobalIndex_[key];
      RealType averageChargeUsingFirstFrame = averageChargeForEachType_[a_name];
      RealType v_radius                     = vanderRUsingGlobalIndex_[key];
      RealType v_radius2                    = v_radius * v_radius;
      for (size_t index = 0; index < zPosUsingGlobalIndex_[key].size();
           ++index) {
        RealType z_pos  = zPosUsingGlobalIndex_[key][index];
        RealType charge = totalChargeUsingGlobalIndex_[key][index];
        RealType chargeDiff =
            fabs(charge - averageCharge) > epsilon ? charge - averageCharge : 0;
        RealType chargeDiffUsingFirstFrameAverage =
            fabs(charge - averageChargeUsingFirstFrame) > epsilon ?
                charge - averageChargeUsingFirstFrame :
                0;

        for (size_t i = 0; i < densityFlucZAverageAllFrame_.size(); ++i) {
          RealType z = -zAve / 2 + i * zAve / densityZAverageAllFrame_.size();
          RealType zdist = z_pos - z;

          RealType gaussian_scale =
              exp(-zdist * zdist / (v_radius2 * 2.0)) /
              (sliceVolume * (sqrt(2 * Constants::PI * v_radius * v_radius)));
          densityZAverageAllFrame_[i] += charge * gaussian_scale;

          densityFlucZAverageAllFrame_[i] += chargeDiff * gaussian_scale;
          absDensityFlucZAverageAllFrame_[i] +=
              abs(chargeDiff) * abs(chargeDiff) * gaussian_scale;

          densityFlucZAverageFirstFrame_[i] +=
              chargeDiffUsingFirstFrameAverage * gaussian_scale;
          absDensityFlucZAverageFirstFrame_[i] +=
              abs(chargeDiffUsingFirstFrameAverage) *
              abs(chargeDiffUsingFirstFrameAverage) * gaussian_scale;
        }
      }
    }

    writeDensity();

    if (genXYZ_) generateXYZForLastFrame();
  }